

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_optimize.cpp
# Opt level: O2

bool __thiscall
ON_LocalZero1::NewtonRaphson
          (ON_LocalZero1 *this,double s0,double f0,double s1,double f1,int maxit,double *t)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  undefined8 in_XMM0_Qb;
  double dVar4;
  undefined8 in_XMM1_Qb;
  double dVar5;
  undefined8 in_XMM2_Qb;
  undefined8 in_XMM3_Qb;
  double f;
  double d;
  double local_c8;
  double local_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  double local_70;
  double local_68;
  undefined8 uStack_60;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  
  bVar3 = true;
  if (((ABS(f1) < ABS(f0)) || (local_68 = s0, this->m_f_tolerance < ABS(f0))) &&
     (local_68 = s1, this->m_f_tolerance < ABS(f1))) {
    local_c8 = f0;
    local_a8 = s0;
    uStack_a0 = in_XMM0_Qb;
    local_98 = s1;
    uStack_90 = in_XMM2_Qb;
    local_88 = f1;
    uStack_80 = in_XMM3_Qb;
    if (0.0 < f0) {
      local_c8 = f1;
      local_a8 = s1;
      uStack_a0 = in_XMM2_Qb;
      local_98 = s0;
      uStack_90 = in_XMM0_Qb;
      local_88 = f0;
      uStack_80 = in_XMM1_Qb;
    }
    local_68 = (s0 + s1) * 0.5;
    uStack_60 = in_XMM0_Qb;
    iVar1 = (*this->_vptr_ON_LocalZero1[2])(local_68,this,&local_b0,&local_70,0);
    if ((char)iVar1 == '\0') {
LAB_005706fa:
      local_68 = (double)(~-(ulong)(ABS(local_c8) <= ABS(local_88)) & (ulong)local_98 |
                         (ulong)local_a8 & -(ulong)(ABS(local_c8) <= ABS(local_88)));
      bVar3 = false;
    }
    else if (this->m_f_tolerance < ABS(local_b0)) {
      if (local_88 <= 0.0) {
LAB_0057073a:
        local_68 = (double)(~-(ulong)(ABS(local_c8) <= ABS(local_88)) & (ulong)local_98 |
                           (ulong)local_a8 & -(ulong)(ABS(local_c8) <= ABS(local_88)));
        bVar3 = false;
      }
      else {
        iVar1 = maxit + 1;
        local_50 = 0.0;
        dVar4 = ABS(local_98 - local_a8);
        do {
          iVar1 = iVar1 + -1;
          if (iVar1 == 0) goto LAB_0057073a;
          if ((0.0 < ((local_98 - local_68) * local_70 + local_b0) *
                     ((local_a8 - local_68) * local_70 + local_b0)) ||
             (ABS(local_50 * local_70) < ABS(local_b0 + local_b0))) {
            local_48 = (local_98 - local_a8) * 0.5;
            dVar5 = local_a8 + local_48;
            uStack_60 = uStack_a0;
            uStack_40 = uStack_90;
            if ((dVar5 == local_a8) && (!NAN(dVar5) && !NAN(local_a8))) {
              local_68 = (double)(~-(ulong)(ABS(local_88) < ABS(local_c8)) & (ulong)dVar5 |
                                 (ulong)local_98 & -(ulong)(ABS(local_88) < ABS(local_c8)));
              goto LAB_00570766;
            }
          }
          else {
            local_48 = -local_b0 / local_70;
            dVar5 = local_68 + local_48;
            if ((dVar5 == local_68) && (!NAN(dVar5) && !NAN(local_68))) {
              local_c8 = ABS(local_c8);
              local_b0 = ABS(local_b0);
              dVar4 = local_c8;
              if (local_b0 <= local_c8) {
                dVar4 = local_b0;
              }
              local_68 = (double)(-(ulong)(ABS(local_88) < dVar4) & (ulong)local_98 |
                                 ~-(ulong)(ABS(local_88) < dVar4) &
                                 (~-(ulong)(local_c8 < local_b0) & (ulong)dVar5 |
                                 (ulong)local_a8 & -(ulong)(local_c8 < local_b0)));
              goto LAB_00570766;
            }
            uStack_40 = 0x8000000000000000;
          }
          local_68 = dVar5;
          local_50 = dVar4;
          iVar2 = (*this->_vptr_ON_LocalZero1[2])(dVar5,this,&local_b0,&local_70,0);
          if ((char)iVar2 == '\0') goto LAB_005706fa;
          dVar4 = ABS(local_b0);
          if (dVar4 <= this->m_f_tolerance) {
            local_c8 = ABS(local_c8);
            dVar5 = local_c8;
            if (dVar4 <= local_c8) {
              dVar5 = dVar4;
            }
            if (dVar5 <= ABS(local_88)) {
              local_98 = local_a8;
            }
            bVar3 = true;
            local_68 = local_98;
            if (dVar4 <= local_c8 && dVar5 <= ABS(local_88)) {
              return true;
            }
            goto LAB_00570766;
          }
          dVar5 = local_b0;
          if (0.0 <= local_b0) {
            uStack_80 = 0;
            local_98 = local_68;
            uStack_90 = uStack_60;
            local_88 = local_b0;
            dVar5 = local_c8;
          }
          local_a8 = (double)(~-(ulong)(local_b0 < 0.0) & (ulong)local_a8 |
                             -(ulong)(local_b0 < 0.0) & (ulong)local_68);
          dVar4 = local_48;
          local_c8 = dVar5;
        } while (this->m_t_tolerance < ABS(local_98 - local_a8));
        local_68 = (double)(~-(ulong)(ABS(dVar5) <= ABS(local_88)) & (ulong)local_98 |
                           -(ulong)(ABS(dVar5) <= ABS(local_88)) & (ulong)local_a8);
      }
    }
  }
LAB_00570766:
  *t = local_68;
  return bVar3;
}

Assistant:

bool ON_LocalZero1::NewtonRaphson( double s0, double f0,
                                    double s1, double f1,
                                    int maxit, double* t )
{
  // private function - input must satisfy
  //
  // 1) t is not nullptr
  //
  // 2) maxit >= 2
  //
  // 3) s0 != s1, 
  //
  // 4) f0 = f(s0), f1 = f(s1), 
  //
  // 5) either f0 < 0.0 and f1 > 0.0, or f0 > 0.0 and f1 < 0.0
  //
  // 6) f() is C0 on [s0,s1] and C2 on (s0,s1)
  //
  // 7) ds_tolerance >= 0.0 - the search for a zero will stop
  //    if the zero in bracketed in an interval that is no
  //    larger than ds_tolerance.
  //
  //    When in doubt, ds_tolerance = (fabs(s0) + fabs(s1))*ON_EPSILON
  //    works well.

  double s, f, d, x, ds, prevds;

  if ( fabs(f0) <= m_f_tolerance && fabs(f0) <= fabs(f1) ) {
    // |f(s0)| <= user specified stopping tolerance
    *t = s0;
    return true;
  }
  if ( fabs(f1) <= m_f_tolerance ) {
    // |f(s1)| <= user specified stopping tolerance
    *t = s1;
    return true;
  }

  if ( f0 > 0.0 ) {
    x = s0; s0 = s1; s1 = x;
    x = f0; f0 = f1; f1 = x;
  }

  s = 0.5*(s0+s1);
  if ( !Evaluate( s, &f, &d, 0 ) ) {
    *t = (fabs(f0) <= fabs(f1)) ? s0 : s1;
    return false;
  }

  if ( fabs(f) <= m_f_tolerance ) {
    // |f(s)| <= user specified stopping tolerance
    *t = s;
    return true;
  }

  if ( f1 <= 0.0 ) {
    *t = (fabs(f0) <= fabs(f1)) ? s0 : s1;
    return false;
  }

  ds = fabs(s1-s0);
  prevds = 0.0;

  while (maxit--) {
    if ( (f+(s0-s)*d)*(f+(s1-s)*d) > 0.0  // true if NR's line segment doesn't cross zero inside interval
         || fabs(2.0*f) > fabs(prevds*d)  // true if expected decrease in function value from previous step didn't happen
         ) {
      // bisect
      prevds = ds;
      ds = 0.5*(s1-s0);
      s = s0+ds;
      if ( s == s0 ) {
        // interval is too small to be divided using double division
        if ( fabs(f1) < fabs(f0) ) {
          s = s1;
        }
        *t = s;
        return true;
      }      
    }
    else {
      // Newton iterate
      prevds = ds;
      ds = -f/d;
      x = s;
      s += ds;
      if ( s == x ) {
        // Newton step size < smallest double than can be added to s
        if ( fabs(f0) < fabs(f) ) {
          f = f0;
          s = s0;
        }
        if ( fabs(f1) < fabs(f) ) {
          s = s1;
        }
        *t = s;
        return true;
      } 
    }

    if ( !Evaluate( s, &f, &d, 0 ) ) {
      *t = (fabs(f0) <= fabs(f1)) ? s0 : s1; // emergency bailout
      return false;
    }

    if ( fabs(f) <= m_f_tolerance ) {
      // |f(s)| <= user specified stopping tolerance
      if ( fabs(f0) < fabs(f) ) {
        f = f0;
        *t = s0;
      }
      if ( fabs(f1) < fabs(f) ) {
        *t = s1;
      }
      return true;
    }

    if ( f < 0.0 ) {
      f0 = f; // f0 needed for emergency bailout
      s0 = s;
    }
    else { // f > 0.0
      f1 = f; // f1 needed for emergency bailout
      s1 = s;
    }

    if ( fabs(s1-s0) <= m_t_tolerance ) {
      // a root has been bracketed to an interval that is small enough
      // to satisfy user.
      *t = (fabs(f0) <= fabs(f1)) ? s0 : s1;
      return true;
    }
  }

  *t = (fabs(f0) <= fabs(f1)) ? s0 : s1; // emergency bailout
  return false;
}